

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void vocinialo(voccxdef *ctx,vocddef **what,int cnt)

{
  vocddef *pvVar1;
  bool bVar2;
  
  pvVar1 = (vocddef *)mchalo(ctx->voccxerr,(long)cnt << 5,"vocinialo");
  *what = pvVar1;
  while (bVar2 = cnt != 0, cnt = cnt + -1, bVar2) {
    pvVar1->vocdfn = 0xffff;
    pvVar1 = pvVar1 + 1;
  }
  return;
}

Assistant:

void vocinialo(voccxdef *ctx, vocddef **what, int cnt)
{
    vocddef *p;
    
    *what = (vocddef *)mchalo(ctx->voccxerr,
                              (cnt * sizeof(vocddef)), "vocinialo");

    /* set all object/function entries to MCMONINV to indicate not-in-use */
    for (p = *what ; cnt ; ++p, --cnt)
        p->vocdfn = MCMONINV;
}